

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,pybind11::object&,pybind11::str>
          (pybind11 *this,object *args_,str *args__1)

{
  PyObject *pPVar1;
  undefined8 uVar2;
  long lVar3;
  cast_error *this_00;
  array<pybind11::object,_2UL> args;
  
  pPVar1 = (args_->super_handle).m_ptr;
  if (pPVar1 == (PyObject *)0x0) {
    args._M_elems[0].super_handle.m_ptr = (handle)(PyObject *)0x0;
  }
  else {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    args._M_elems[0] = (object)(args_->super_handle).m_ptr;
  }
  pPVar1 = (args__1->super_object).super_handle.m_ptr;
  if (pPVar1 == (PyObject *)0x0) {
    args._M_elems[1].super_handle.m_ptr = (handle)(PyObject *)0x0;
  }
  else {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    args._M_elems[1].super_handle.m_ptr = (handle)(args__1->super_object).super_handle.m_ptr;
    if ((args._M_elems[0].super_handle.m_ptr != (PyObject *)0x0) &&
       (args._M_elems[1].super_handle.m_ptr != (PyObject *)0x0)) {
      tuple::tuple((tuple *)this,2);
      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 8) {
        uVar2 = *(undefined8 *)((long)&args._M_elems[0].super_handle.m_ptr + lVar3);
        *(undefined8 *)((long)&args._M_elems[0].super_handle.m_ptr + lVar3) = 0;
        *(undefined8 *)(*(long *)this + 0x18 + lVar3) = uVar2;
      }
      std::array<pybind11::object,_2UL>::~array(&args);
      return (object)(object)this;
    }
  }
  this_00 = (cast_error *)__cxa_allocate_exception(0x10);
  cast_error::runtime_error
            (this_00,
             "make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)"
            );
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}